

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

Split * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::findFallback(Split *__return_storage_ptr__,
              BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
              *this,SetMB *set)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  PrimRefVector pmVar6;
  PrimRefMB *pPVar7;
  long lVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar4 = (set->super_PrimInfoMB).object_range._begin;
  uVar5 = (set->super_PrimInfoMB).object_range._end;
  if (uVar5 == uVar4) {
LAB_00502f90:
    uVar10 = 1;
    fVar12 = 0.0;
    if ((this->cfg).singleLeafTimeSegment == true) {
      pmVar6 = set->prims;
      fVar1 = (set->super_PrimInfoMB).time_range.lower;
      fVar2 = (set->super_PrimInfoMB).time_range.upper;
      uVar11 = uVar4 - 1;
      lVar8 = uVar4 * 0x50 + 0x40;
      do {
        fVar12 = 0.0;
        uVar11 = uVar11 + 1;
        if (uVar5 <= uVar11) {
          uVar10 = 1;
          goto LAB_005030eb;
        }
        pPVar7 = pmVar6->items;
        uVar3 = *(undefined8 *)((long)&(pPVar7->lbounds).bounds0.lower.field_0 + lVar8);
        fVar12 = (float)uVar3;
        fVar16 = (float)*(uint *)((long)pPVar7 + lVar8 + -4);
        fVar15 = (float)((ulong)uVar3 >> 0x20) - fVar12;
        fVar13 = floorf(((fVar1 - fVar12) / fVar15) * 1.0000002 * fVar16);
        fVar14 = 0.0;
        if (0.0 <= fVar13) {
          fVar14 = fVar13;
        }
        fVar13 = ceilf(((fVar2 - fVar12) / fVar15) * 0.99999976 * fVar16);
        if (fVar16 <= fVar13) {
          fVar13 = fVar16;
        }
        lVar8 = lVar8 + 0x50;
      } while ((int)fVar13 - (int)fVar14 < 2);
      uVar10 = 2;
      fVar12 = fVar12 + (fVar15 * (float)(((int)fVar13 + (int)fVar14) / 2)) / fVar16;
    }
  }
  else {
    pPVar7 = set->prims->items;
    uVar10 = 3;
    pfVar9 = pPVar7[uVar4 + 1].lbounds.bounds0.lower.field_0.m128 + 3;
    uVar11 = uVar4;
    do {
      uVar11 = uVar11 + 1;
      if (uVar5 <= uVar11) goto LAB_00502f90;
      fVar12 = *pfVar9;
      pfVar9 = pfVar9 + 0x14;
    } while (fVar12 == pPVar7[uVar4].lbounds.bounds0.lower.field_0.m128[3]);
    fVar12 = 0.0;
  }
LAB_005030eb:
  __return_storage_ptr__->sah = 0.0;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = (int)fVar12;
  __return_storage_ptr__->data = uVar10;
  return __return_storage_ptr__;
}

Assistant:

__noinline Split findFallback(const SetMB& set)
          {
            /* split if primitives are not from same geometry */
            if (!sameGeometry(set))
              return Split(0.0f,Split::SPLIT_GEOMID);
            
            /* if a leaf can only hold a single time-segment, we might have to do additional temporal splits */
            if (cfg.singleLeafTimeSegment)
            {
              /* test if one primitive has more than one time segment in time range, if so split time */
              for (size_t i=set.begin(); i<set.end(); i++)
              {
                const PrimRefMB& prim = (*set.prims)[i];
                const range<int> itime_range = prim.timeSegmentRange(set.time_range);
                const int localTimeSegments = itime_range.size();
                assert(localTimeSegments > 0);
                if (localTimeSegments > 1) {
                  const int icenter = (itime_range.begin() + itime_range.end())/2;
                  const float splitTime = prim.timeStep(icenter);
                  return Split(0.0f,(unsigned)Split::SPLIT_TEMPORAL,0,splitTime);
                }
              }
            }        

            /* otherwise return fallback split */
            return Split(0.0f,Split::SPLIT_FALLBACK);
          }